

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cc
# Opt level: O0

void __thiscall entityx::EntityManager::reset(EntityManager *this)

{
  bool bVar1;
  reference ppBVar2;
  reference ppBVar3;
  long in_RDI;
  BaseComponentHelper *helper;
  iterator __end1_2;
  iterator __begin1_2;
  vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
  *__range1_2;
  BasePool *pool;
  iterator __end1_1;
  iterator __begin1_1;
  vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *__range1_1;
  Entity entity;
  Iterator __end1;
  Iterator __begin1;
  DebugView *__range1;
  BaseComponentHelper *in_stack_ffffffffffffff28;
  BaseComponentHelper *pBVar4;
  BasePool *in_stack_ffffffffffffff30;
  BasePool *pBVar5;
  BaseView<true> *in_stack_ffffffffffffff40;
  __normal_iterator<entityx::BaseComponentHelper_**,_std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>_>
  local_b0;
  long local_a8;
  BasePool *local_a0;
  BasePool **local_98;
  __normal_iterator<entityx::BasePool_**,_std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>_>
  local_90;
  long local_88;
  Entity local_80;
  Iterator local_70;
  ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> local_48;
  DebugView local_20;
  DebugView *local_10;
  
  local_20 = entities_for_debugging((EntityManager *)0x1138e1);
  local_10 = &local_20;
  BaseView<true>::begin((BaseView<true> *)in_stack_ffffffffffffff30);
  BaseView<true>::end(in_stack_ffffffffffffff40);
  while (bVar1 = ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::operator!=
                           (&local_48,&local_70), bVar1) {
    local_80 = ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::operator*
                         ((ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> *)
                          in_stack_ffffffffffffff30);
    Entity::destroy((Entity *)in_stack_ffffffffffffff30);
    ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::operator++
              ((ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> *)
               in_stack_ffffffffffffff30);
  }
  local_88 = in_RDI + 0x18;
  local_90._M_current =
       (BasePool **)
       std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::begin
                 ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                  in_stack_ffffffffffffff28);
  local_98 = (BasePool **)
             std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::end
                       ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                        in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<entityx::BasePool_**,_std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<entityx::BasePool_**,_std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    ppBVar2 = __gnu_cxx::
              __normal_iterator<entityx::BasePool_**,_std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>_>
              ::operator*(&local_90);
    pBVar5 = *ppBVar2;
    local_a0 = pBVar5;
    if ((pBVar5 != (BasePool *)0x0) &&
       (in_stack_ffffffffffffff30 = pBVar5, pBVar5 != (BasePool *)0x0)) {
      (*pBVar5->_vptr_BasePool[1])();
      in_stack_ffffffffffffff30 = pBVar5;
    }
    __gnu_cxx::
    __normal_iterator<entityx::BasePool_**,_std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>_>
    ::operator++(&local_90);
  }
  local_a8 = in_RDI + 0x30;
  local_b0._M_current =
       (BaseComponentHelper **)
       std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
       ::begin((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                *)in_stack_ffffffffffffff28);
  std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::end
            ((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
              *)in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<entityx::BaseComponentHelper_**,_std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<entityx::BaseComponentHelper_**,_std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    ppBVar3 = __gnu_cxx::
              __normal_iterator<entityx::BaseComponentHelper_**,_std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>_>
              ::operator*(&local_b0);
    pBVar4 = *ppBVar3;
    if ((pBVar4 != (BaseComponentHelper *)0x0) &&
       (in_stack_ffffffffffffff28 = pBVar4, pBVar4 != (BaseComponentHelper *)0x0)) {
      (**(code **)(*(long *)pBVar4 + 8))();
      in_stack_ffffffffffffff28 = pBVar4;
    }
    __gnu_cxx::
    __normal_iterator<entityx::BaseComponentHelper_**,_std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>_>
    ::operator++(&local_b0);
  }
  std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::clear
            ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)0x113a88);
  std::vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::
  clear((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_> *)
        0x113a96);
  std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::clear
            ((vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)0x113aa4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x113ab2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x113ac0);
  *(undefined4 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

void EntityManager::reset() {
  for (Entity entity : entities_for_debugging()) entity.destroy();
  for (BasePool *pool : component_pools_) {
    if (pool) delete pool;
  }
  for (BaseComponentHelper *helper : component_helpers_) {
    if (helper) delete helper;
  }
  component_pools_.clear();
  component_helpers_.clear();
  entity_component_mask_.clear();
  entity_version_.clear();
  free_list_.clear();
  index_counter_ = 0;
}